

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadTable
          (BinaryReader *this,Type *out_elem_type,Limits *out_elem_limits)

{
  Result RVar1;
  char *format;
  uint8_t flags;
  uint32_t max;
  uint32_t initial;
  byte local_29;
  uint32_t local_28;
  uint local_24;
  
  RVar1 = ReadRefType(this,out_elem_type,"table elem type");
  if (RVar1.enum_ != Error) {
    local_28 = 0;
    RVar1 = ReadU8(this,&local_29,"table flags");
    if (RVar1.enum_ != Error) {
      if ((local_29 & 2) == 0) {
        if ((local_29 & 4) == 0) {
          if (7 < local_29) {
            PrintError(this,"malformed table limits flag: %d",(ulong)local_29);
            return (Result)Error;
          }
          RVar1 = ReadU32Leb128(this,&local_24,"table initial elem count");
          if (RVar1.enum_ == Error) {
            return (Result)Error;
          }
          if (((local_29 & 1) != 0) &&
             (RVar1 = ReadU32Leb128(this,&local_28,"table max elem count"), RVar1.enum_ == Error)) {
            return (Result)Error;
          }
          out_elem_limits->has_max = (bool)(local_29 & 1);
          out_elem_limits->initial = (ulong)local_24;
          out_elem_limits->max = (ulong)local_28;
          return (Result)Ok;
        }
        format = "tables may not be 64-bit";
      }
      else {
        format = "tables may not be shared";
      }
      PrintError(this,format);
    }
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadTable(Type* out_elem_type, Limits* out_elem_limits) {
  CHECK_RESULT(ReadRefType(out_elem_type, "table elem type"));

  uint8_t flags;
  uint32_t initial;
  uint32_t max = 0;
  CHECK_RESULT(ReadU8(&flags, "table flags"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  bool is_64 = flags & WABT_BINARY_LIMITS_IS_64_FLAG;
  const uint8_t unknown_flags = flags & ~WABT_BINARY_LIMITS_ALL_FLAGS;
  ERROR_IF(is_shared, "tables may not be shared");
  ERROR_IF(is_64, "tables may not be 64-bit");
  ERROR_UNLESS(unknown_flags == 0, "malformed table limits flag: %d", flags);
  CHECK_RESULT(ReadU32Leb128(&initial, "table initial elem count"));
  if (has_max) {
    CHECK_RESULT(ReadU32Leb128(&max, "table max elem count"));
  }

  out_elem_limits->has_max = has_max;
  out_elem_limits->initial = initial;
  out_elem_limits->max = max;
  return Result::Ok;
}